

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_utils.c
# Opt level: O2

RK_S32 mpi_enc_opt_s(void *ctx,char *next)

{
  int iVar1;
  
  *(undefined4 *)((long)ctx + 0x34) = 0xffffffff;
  if (next == (char *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = atoi(next);
    *(int *)((long)ctx + 0x34) = iVar1;
    if (0 < iVar1) {
      return 1;
    }
  }
  _mpp_log_l(2,"mpi_enc_utils","invalid nthreads %d\n",0,iVar1);
  *(undefined4 *)((long)ctx + 0x34) = 1;
  return 0;
}

Assistant:

RK_S32 mpi_enc_opt_s(void *ctx, const char *next)
{
    MpiEncTestArgs *cmd = (MpiEncTestArgs *)ctx;

    cmd->nthreads = -1;
    if (next) {
        cmd->nthreads = atoi(next);
        if (cmd->nthreads >= 1)
            return 1;
    }

    mpp_err("invalid nthreads %d\n", cmd->nthreads);
    cmd->nthreads = 1;
    return 0;
}